

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

CopyCtrFn QtPrivate::QMetaTypeForType<char16_t>::getCopyCtr(void)

{
  return (CopyCtrFn)0x0;
}

Assistant:

static constexpr QMetaTypeInterface::CopyCtrFn getCopyCtr()
    {
        if constexpr (std::is_copy_constructible_v<S> && !std::is_trivially_copy_constructible_v<S>) {
            return [](const QMetaTypeInterface *, void *addr, const void *other) {
                if constexpr (qxp::is_detected_v<QMetaTypeCopyTraits::HasDeprecatedCopyConstructorTest, S>) {
#if !defined(QT_BOOTSTRAPPED)
                    QMetaTypeCopyTraits::warnAboutDeprecatedCopy(getName());
#endif
                    QT_IGNORE_DEPRECATIONS(new (addr) S(*reinterpret_cast<const S *>(other));)
                } else {
                    new (addr) S(*reinterpret_cast<const S *>(other));
                }
            };
        } else {
            return nullptr;
        }
    }